

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

nng_socket nng_pipe_socket(nng_pipe p)

{
  nng_err nVar1;
  uint32_t uVar2;
  nni_pipe *in_RAX;
  nni_pipe *local_18;
  nni_pipe *pipe;
  
  local_18 = in_RAX;
  nVar1 = nni_pipe_find(&local_18,p.id);
  uVar2 = 0;
  if (nVar1 == NNG_OK) {
    uVar2 = nni_pipe_sock_id(local_18);
    nni_pipe_rele(local_18);
  }
  return (nng_socket)uVar2;
}

Assistant:

nng_socket
nng_pipe_socket(nng_pipe p)
{
	nng_socket s = NNG_SOCKET_INITIALIZER;
	nni_pipe  *pipe;

	if (nni_pipe_find(&pipe, p.id) == 0) {
		s.id = nni_pipe_sock_id(pipe);
		nni_pipe_rele(pipe);
	}
	return (s);
}